

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void av1_loop_restoration_save_boundary_lines
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int after_cdef)

{
  int iVar1;
  AV1_COMMON *in_RSI;
  int p;
  int use_highbd;
  int num_planes;
  int in_stack_0000003c;
  AV1_COMMON *in_stack_00000040;
  int in_stack_00000048;
  int in_stack_0000004c;
  YV12_BUFFER_CONFIG *in_stack_00000050;
  undefined4 local_20;
  
  iVar1 = av1_num_planes(in_RSI);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    save_boundary_lines(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000040,
                        in_stack_0000003c);
  }
  return;
}

Assistant:

void av1_loop_restoration_save_boundary_lines(const YV12_BUFFER_CONFIG *frame,
                                              AV1_COMMON *cm, int after_cdef) {
  const int num_planes = av1_num_planes(cm);
  const int use_highbd = cm->seq_params->use_highbitdepth;
  for (int p = 0; p < num_planes; ++p) {
    save_boundary_lines(frame, use_highbd, p, cm, after_cdef);
  }
}